

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_le.c
# Opt level: O0

OnigCodePoint utf16le_mbc_to_code(OnigUChar *p,OnigUChar *end)

{
  byte bVar1;
  OnigCodePoint local_1c;
  OnigUChar c1;
  OnigUChar c0;
  OnigCodePoint code;
  OnigUChar *end_local;
  OnigUChar *p_local;
  
  bVar1 = p[1];
  if ((bVar1 & 0xfc) == 0xd8) {
    local_1c = ((bVar1 - 0xd8) * 4 + ((int)(*p & 0xc0) >> 6) + 1) * 0x10000 +
               ((*p & 0x3f) * 4 + (p[3] - 0xdc)) * 0x100 + (uint)p[2];
  }
  else {
    local_1c = (uint)bVar1 * 0x100 + (uint)*p;
  }
  return local_1c;
}

Assistant:

static OnigCodePoint
utf16le_mbc_to_code(const UChar* p, const UChar* end ARG_UNUSED)
{
  OnigCodePoint code;
  UChar c0 = *p;
  UChar c1 = *(p+1);

  if (UTF16_IS_SURROGATE_FIRST(c1)) {
    code = ((((c1 - 0xd8) << 2) + ((c0  & 0xc0) >> 6) + 1) << 16)
         + ((((c0 & 0x3f) << 2) + (p[3] - 0xdc)) << 8)
         + p[2];
  }
  else {
    code = c1 * 256 + p[0];
  }
  return code;
}